

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setStyle(QWidget *this,QStyle *style)

{
  QWidgetPrivate *this_00;
  long lVar1;
  QStyleSheetStyle *this_01;
  QWidgetPrivate *d;
  long in_FS_OFFSET;
  bool propagate;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if ((style != (QStyle *)0x0) != (bool)((byte)(this_00->high_attributes[1] >> 0x16) & 1)) {
    this_00->high_attributes[1] =
         (uint)(style != (QStyle *)0x0) << 0x16 | this_00->high_attributes[1] & 0xffbfffff;
  }
  QWidgetPrivate::createExtra(this_00);
  lVar1 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (lVar1 == 0) {
    lVar1 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
    propagate = true;
    if (lVar1 == 0) {
      QApplication::styleSheet(&local_48,QCoreApplication::self);
      propagate = local_48.d.size != 0;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (propagate) {
      this_01 = (QStyleSheetStyle *)operator_new(0x60);
      QStyleSheetStyle::QStyleSheetStyle(this_01,style);
      style = (QStyle *)this_01;
    }
    QWidgetPrivate::setStyle_helper(this_00,style,propagate);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) + 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetPrivate::setStyle_helper(this_00,style,false);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setStyle(QStyle *style)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_SetStyle, style != nullptr);
    d->createExtra();
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle *styleSheetStyle = qt_styleSheet(style)) {
        //if for some reason someone try to set a QStyleSheetStyle, ref it
        //(this may happen for example in QButtonDialogBox which propagates its style)
        styleSheetStyle->ref();
        d->setStyle_helper(style, false);
    } else if (qt_styleSheet(d->extra->style) || !qApp->styleSheet().isEmpty()) {
        // if we have an application stylesheet or have a proxy already, propagate
        d->setStyle_helper(new QStyleSheetStyle(style), true);
    } else
#endif
        d->setStyle_helper(style, false);
}